

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O1

void __thiscall Kernel::Inference::Inference(Inference *this,GeneratingInferenceMany *gi)

{
  uint uVar1;
  UnitList *pUVar2;
  uint uVar3;
  
  initMany(this,gi->rule,gi->premises);
  this->_age = 0;
  pUVar2 = gi->premises;
  if (pUVar2 != (UnitList *)0x0) {
    uVar3 = 0;
    do {
      uVar1 = (pUVar2->_head->_inference)._age;
      if (uVar3 <= uVar1) {
        uVar3 = uVar1;
      }
      this->_age = uVar3;
      pUVar2 = pUVar2->_tail;
    } while (pUVar2 != (List<Kernel::Unit_*> *)0x0);
  }
  this->_age = this->_age + 1;
  return;
}

Assistant:

Inference::Inference(const GeneratingInferenceMany& gi) {
  initMany(gi.rule,gi.premises);

  ASS_REP(isGeneratingInferenceRule(gi.rule),ruleName(gi.rule));
  _age = 0;
  UnitList* it= gi.premises;
  while(it) {
    Unit* prem = it->head();
    ASS(prem->isClause());
    _age = std::max(_age,prem->inference().age());
    it=it->tail();
  }
  _age++;
}